

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::DecimalQuantity::_setToLong(DecimalQuantity *this,int64_t n)

{
  undefined1 uVar1;
  UBool UVar2;
  UErrorCode local_7c;
  undefined1 local_78 [4];
  UErrorCode localStatus;
  DecNum decnum;
  int64_t n_local;
  DecimalQuantity *this_local;
  
  decnum._88_8_ = n;
  if (n == -0x8000000000000000) {
    DecNum::DecNum((DecNum *)local_78);
    local_7c = U_ZERO_ERROR;
    DecNum::setTo((DecNum *)local_78,"9.223372036854775808E+18",&local_7c);
    UVar2 = ::U_FAILURE(local_7c);
    if (UVar2 == '\0') {
      uVar1 = this->flags;
      this->flags = uVar1 | ::(anonymous_namespace)::NEGATIVE_FLAG;
      readDecNumberToBcd(this,(DecNum *)local_78);
    }
    DecNum::~DecNum((DecNum *)local_78);
  }
  else if (n < 0x80000000) {
    readIntToBcd(this,(int32_t)n);
  }
  else {
    readLongToBcd(this,n);
  }
  return;
}

Assistant:

void DecimalQuantity::_setToLong(int64_t n) {
    if (n == INT64_MIN) {
        DecNum decnum;
        UErrorCode localStatus = U_ZERO_ERROR;
        decnum.setTo("9.223372036854775808E+18", localStatus);
        if (U_FAILURE(localStatus)) { return; } // unexpected
        flags |= NEGATIVE_FLAG;
        readDecNumberToBcd(decnum);
    } else if (n <= INT32_MAX) {
        readIntToBcd(static_cast<int32_t>(n));
    } else {
        readLongToBcd(n);
    }
}